

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

void nk_buffer_init_fixed(nk_buffer *b,void *m,nk_size size)

{
  if (b == (nk_buffer *)0x0) {
    __assert_fail("b",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x198d,"void nk_buffer_init_fixed(struct nk_buffer *, void *, nk_size)");
  }
  if (m != (void *)0x0) {
    if (size != 0) {
      nk_zero(b,0x78);
      b->type = NK_BUFFER_FIXED;
      (b->memory).ptr = m;
      (b->memory).size = size;
      b->size = size;
      return;
    }
    __assert_fail("size",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x198f,"void nk_buffer_init_fixed(struct nk_buffer *, void *, nk_size)");
  }
  __assert_fail("m",
                "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                ,0x198e,"void nk_buffer_init_fixed(struct nk_buffer *, void *, nk_size)");
}

Assistant:

NK_API void
nk_buffer_init_fixed(struct nk_buffer *b, void *m, nk_size size)
{
    NK_ASSERT(b);
    NK_ASSERT(m);
    NK_ASSERT(size);
    if (!b || !m || !size) return;

    nk_zero(b, sizeof(*b));
    b->type = NK_BUFFER_FIXED;
    b->memory.ptr = m;
    b->memory.size = size;
    b->size = size;
}